

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::decideNextBranch(Solver *this,double f)

{
  uint max;
  int iVar1;
  uint uVar2;
  fd_set *in_RCX;
  fd_set *in_RDX;
  fd_set *extraout_RDX;
  fd_set *in_R8;
  timeval *in_R9;
  bool bVar3;
  double dVar4;
  Literal local_14;
  
  if ((0.0 < f) && (dVar4 = RNG::drand(&this->rng), in_RDX = extraout_RDX, dVar4 < f)) {
    max = (this->assign_).assign_.ebo_.size;
    uVar2 = (this->assign_).elims_;
    in_RCX = (fd_set *)(ulong)uVar2;
    if (max != (this->assign_).trail.ebo_.size + uVar2 + 1) {
      uVar2 = RNG::irand(&this->rng,max);
      while (((this->assign_).assign_.ebo_.buf[uVar2] & 3) != 0) {
        bVar3 = uVar2 == max - 1;
        uVar2 = uVar2 + 1;
        if (bVar3) {
          uVar2 = 1;
        }
      }
      local_14 = DecisionHeuristic::selectLiteral(this,uVar2,0);
      bVar3 = assume(this,&local_14);
      return bVar3;
    }
  }
  iVar1 = DecisionHeuristic::select
                    ((DecisionHeuristic *)((this->heuristic_).ptr_ & 0xfffffffffffffffe),(int)this,
                     in_RDX,in_RCX,in_R8,in_R9);
  return SUB41(iVar1,0);
}

Assistant:

bool Solver::decideNextBranch(double f) {
	if (f <= 0.0 || rng.drand() >= f || numFreeVars() == 0) {
		return heuristic_->select(*this);
	}
	// select randomly
	Literal choice;
	uint32 maxVar = numVars() + 1;
	for (uint32 v = rng.irand(maxVar);;) {
		if (value(v) == value_free) {
			choice    = heuristic_->selectLiteral(*this, v, 0);
			break;
		}
		if (++v == maxVar) { v = 1; }
	}
	return assume(choice);
}